

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cc
# Opt level: O3

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
xemmai::t_threading::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_threading *this)

{
  __pointer_type ptVar1;
  t_object *local_78;
  t_value<xemmai::t_pointer> local_70;
  t_threading *local_60;
  vector<xemmai::t_root,_std::allocator<xemmai::t_root>_> local_58;
  pointer ppStack_40;
  pointer local_38;
  pointer ppStack_30;
  
  t_type_of<std::mutex>::f_define(this);
  t_type_of<std::condition_variable>::f_define(this);
  local_58.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  ptVar1 = (this->v_type_mutex).v_slot.v_p._M_b._M_p;
  local_60 = this;
  local_78 = (t_object *)xemmai::t_symbol::f_instantiate(5,L"Mutex");
  local_70.super_t_pointer.v_p = ptVar1;
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_value<xemmai::t_pointer>>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&ppStack_40,&local_78,&local_70);
  ptVar1 = (this->v_type_condition).v_slot.v_p._M_b._M_p;
  local_78 = (t_object *)xemmai::t_symbol::f_instantiate(9,L"Condition");
  local_70.super_t_pointer.v_p = ptVar1;
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_value<xemmai::t_pointer>>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&ppStack_40,&local_78,&local_70);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = ppStack_40;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = local_38;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = ppStack_30;
  ppStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)&ppStack_40);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_threading::f_define()
{
	t_type_of<std::mutex>::f_define(this);
	t_type_of<std::condition_variable>::f_define(this);
	return t_define(this)
	(L"Mutex"sv, static_cast<t_object*>(v_type_mutex))
	(L"Condition"sv, static_cast<t_object*>(v_type_condition))
	;
}